

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mct.c
# Opt level: O0

void opj_mct_encode(OPJ_INT32 *c0,OPJ_INT32 *c1,OPJ_INT32 *c2,OPJ_SIZE_T n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [16];
  OPJ_INT32 v_1;
  OPJ_INT32 u_1;
  OPJ_INT32 y_1;
  OPJ_INT32 b_1;
  OPJ_INT32 g_1;
  OPJ_INT32 r_1;
  __m128i b;
  __m128i g;
  __m128i r;
  __m128i v;
  __m128i u;
  __m128i y;
  OPJ_SIZE_T len;
  OPJ_SIZE_T i;
  OPJ_SIZE_T n_local;
  OPJ_INT32 *c2_local;
  OPJ_INT32 *c1_local;
  OPJ_INT32 *c0_local;
  int local_128;
  int iStack_124;
  int iStack_120;
  int iStack_11c;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  
  if (((ulong)c0 & 0xf) != 0) {
    __assert_fail("((size_t)c0 & 0xf) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                  ,0x55,
                  "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
                 );
  }
  if (((ulong)c1 & 0xf) != 0) {
    __assert_fail("((size_t)c1 & 0xf) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                  ,0x56,
                  "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
                 );
  }
  if (((ulong)c2 & 0xf) != 0) {
    __assert_fail("((size_t)c2 & 0xf) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/mct.c"
                  ,0x57,
                  "void opj_mct_encode(OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_INT32 *restrict, OPJ_SIZE_T)"
                 );
  }
  for (len = 0; len < (n & 0xfffffffc); len = len + 4) {
    uVar4 = *(undefined8 *)(c0 + len);
    uVar5 = *(undefined8 *)(c0 + len + 2);
    uVar6 = *(undefined8 *)(c1 + len);
    uVar7 = *(undefined8 *)(c1 + len + 2);
    uVar8 = *(undefined8 *)(c2 + len);
    uVar9 = *(undefined8 *)(c2 + len + 2);
    local_d8 = (int)uVar6;
    iStack_d4 = (int)((ulong)uVar6 >> 0x20);
    iStack_d0 = (int)uVar7;
    iStack_cc = (int)((ulong)uVar7 >> 0x20);
    local_108 = (int)uVar8;
    iStack_104 = (int)((ulong)uVar8 >> 0x20);
    iStack_100 = (int)uVar9;
    iStack_fc = (int)((ulong)uVar9 >> 0x20);
    local_128 = (int)uVar4;
    iStack_124 = (int)((ulong)uVar4 >> 0x20);
    iStack_120 = (int)uVar5;
    iStack_11c = (int)((ulong)uVar5 >> 0x20);
    auVar10 = ZEXT416(2);
    *(ulong *)(c0 + len) =
         CONCAT44(iStack_d4 * 2 + iStack_104 + iStack_124 >> auVar10,
                  local_d8 * 2 + local_108 + local_128 >> auVar10);
    *(ulong *)(c0 + len + 2) =
         CONCAT44(iStack_cc * 2 + iStack_fc + iStack_11c >> auVar10,
                  iStack_d0 * 2 + iStack_100 + iStack_120 >> auVar10);
    *(ulong *)(c1 + len) = CONCAT44(iStack_104 - iStack_d4,local_108 - local_d8);
    *(ulong *)(c1 + len + 2) = CONCAT44(iStack_fc - iStack_cc,iStack_100 - iStack_d0);
    *(ulong *)(c2 + len) = CONCAT44(iStack_124 - iStack_d4,local_128 - local_d8);
    *(ulong *)(c2 + len + 2) = CONCAT44(iStack_11c - iStack_cc,iStack_120 - iStack_d0);
  }
  for (; len < n; len = len + 1) {
    iVar1 = c0[len];
    iVar2 = c1[len];
    iVar3 = c2[len];
    c0[len] = iVar1 + iVar2 * 2 + iVar3 >> 2;
    c1[len] = iVar3 - iVar2;
    c2[len] = iVar1 - iVar2;
  }
  return;
}

Assistant:

void opj_mct_encode(
    OPJ_INT32* OPJ_RESTRICT c0,
    OPJ_INT32* OPJ_RESTRICT c1,
    OPJ_INT32* OPJ_RESTRICT c2,
    OPJ_SIZE_T n)
{
    OPJ_SIZE_T i;
    const OPJ_SIZE_T len = n;
    /* buffer are aligned on 16 bytes */
    assert(((size_t)c0 & 0xf) == 0);
    assert(((size_t)c1 & 0xf) == 0);
    assert(((size_t)c2 & 0xf) == 0);

    for (i = 0; i < (len & ~3U); i += 4) {
        __m128i y, u, v;
        __m128i r = _mm_load_si128((const __m128i *) & (c0[i]));
        __m128i g = _mm_load_si128((const __m128i *) & (c1[i]));
        __m128i b = _mm_load_si128((const __m128i *) & (c2[i]));
        y = _mm_add_epi32(g, g);
        y = _mm_add_epi32(y, b);
        y = _mm_add_epi32(y, r);
        y = _mm_srai_epi32(y, 2);
        u = _mm_sub_epi32(b, g);
        v = _mm_sub_epi32(r, g);
        _mm_store_si128((__m128i *) & (c0[i]), y);
        _mm_store_si128((__m128i *) & (c1[i]), u);
        _mm_store_si128((__m128i *) & (c2[i]), v);
    }

    for (; i < len; ++i) {
        OPJ_INT32 r = c0[i];
        OPJ_INT32 g = c1[i];
        OPJ_INT32 b = c2[i];
        OPJ_INT32 y = (r + (g * 2) + b) >> 2;
        OPJ_INT32 u = b - g;
        OPJ_INT32 v = r - g;
        c0[i] = y;
        c1[i] = u;
        c2[i] = v;
    }
}